

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

monst * mk_roamer(permonst *ptr,aligntyp alignment,level *lev,xchar x,xchar y,boolean peaceful)

{
  bool bVar1;
  monst *local_60;
  boolean coaligned;
  monst *roamer;
  boolean peaceful_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  aligntyp alignment_local;
  permonst *ptr_local;
  
  bVar1 = u.ualign.type == alignment;
  if ((ptr == mons + 0x11f) || (ptr == mons + 0x7f)) {
    if ((lev->monsters[x][y] != (monst *)0x0) &&
       ((*(uint *)&lev->monsters[x][y]->field_0x60 >> 9 & 1) == 0)) {
      if ((lev->monsters[x][y] == (monst *)0x0) ||
         ((*(uint *)&lev->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
        local_60 = (monst *)0x0;
      }
      else {
        local_60 = lev->monsters[x][y];
      }
      rloc(lev,local_60,'\0');
    }
    ptr_local = (permonst *)makemon(ptr,lev,(int)x,(int)y,0);
    if ((monst *)ptr_local == (monst *)0x0) {
      ptr_local = (permonst *)0x0;
    }
    else {
      ((monst *)ptr_local)->field_0x74 = alignment;
      if ((bVar1) && (peaceful == '\0')) {
        ((monst *)ptr_local)->field_0x75 = 1;
      }
      *(uint *)&((monst *)ptr_local)->field_0x60 =
           *(uint *)&((monst *)ptr_local)->field_0x60 & 0xfbffffff | 0x4000000;
      ((monst *)ptr_local)->mtrapseen = 0xffffffff;
      *(uint *)&((monst *)ptr_local)->field_0x60 =
           *(uint *)&((monst *)ptr_local)->field_0x60 & 0xffbfffff | ((int)peaceful & 1U) << 0x16;
      *(uint *)&((monst *)ptr_local)->field_0x60 =
           *(uint *)&((monst *)ptr_local)->field_0x60 & 0xfff7ffff;
      set_malign((monst *)ptr_local);
    }
  }
  else {
    ptr_local = (permonst *)0x0;
  }
  return (monst *)ptr_local;
}

Assistant:

struct monst *mk_roamer(const struct permonst *ptr, aligntyp alignment,
			struct level *lev, xchar x, xchar y, boolean peaceful)
{
	struct monst *roamer;
	boolean coaligned = (u.ualign.type == alignment);

	if (ptr != &mons[PM_ALIGNED_PRIEST] && ptr != &mons[PM_ANGEL])
		return NULL;
	
	if (MON_AT(lev, x, y)) rloc(lev, m_at(lev, x, y), FALSE);	/* insurance */

	if (!(roamer = makemon(ptr, lev, x, y, NO_MM_FLAGS)))
		return NULL;

	EPRI(roamer)->shralign = alignment;
	if (coaligned && !peaceful)
		EPRI(roamer)->renegade = TRUE;
	/* roamer->ispriest == FALSE naturally */
	roamer->isminion = TRUE;	/* borrowing this bit */
	roamer->mtrapseen = ~0;		/* traps are known */
	roamer->mpeaceful = peaceful;
	roamer->msleeping = 0;
	set_malign(roamer); /* peaceful may have changed */

	/* MORE TO COME */
	return roamer;
}